

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
ArrayToVectorState<false,_float>::Float
          (ArrayToVectorState<false,_float> *this,Context<false> *param_1,float f)

{
  float local_c;
  
  local_c = f;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this->output_array,&local_c);
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& /* ctx */, float f)
  {
    output_array->push_back((T)f);
    return this;
  }